

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_font * rf_load_image_font_from_data
                    (rf_font *__return_storage_ptr__,rf_image image,rf_glyph_info *glyphs,
                    rf_int glyphs_count)

{
  rf_image image_00;
  undefined1 auVar1 [16];
  rf_font *prVar2;
  rf_font *result;
  rf_int glyphs_count_local;
  rf_glyph_info *glyphs_local;
  
  __return_storage_ptr__->base_size = 0;
  auVar1 = image._8_16_;
  image_00._16_8_ = __return_storage_ptr__;
  image_00.data = (void *)auVar1._0_8_;
  image_00.width = auVar1._8_4_;
  image_00.height = auVar1._12_4_;
  prVar2 = __return_storage_ptr__;
  rf_load_texture_from_image(image_00);
  __return_storage_ptr__->glyphs = glyphs;
  __return_storage_ptr__->glyphs_count = glyphs_count;
  __return_storage_ptr__->valid = false;
  if (((((undefined1  [24])image & (undefined1  [24])0x100000000) != (undefined1  [24])0x0) &&
      (glyphs != (rf_glyph_info *)0x0)) && (0 < glyphs_count)) {
    __return_storage_ptr__->base_size = (int)(glyphs->field_0).rec.height;
    __return_storage_ptr__->valid = true;
  }
  return prVar2;
}

Assistant:

RF_API rf_font rf_load_image_font_from_data(rf_image image, rf_glyph_info* glyphs, rf_int glyphs_count)
{
    rf_font result = {
        .texture      = rf_load_texture_from_image(image),
        .glyphs       = glyphs,
        .glyphs_count = glyphs_count,
    };

    if (image.valid && glyphs && glyphs_count > 0)
    {
        result.base_size = glyphs[0].height;
        result.valid     = true;
    }

    return result;
}